

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx2::GridMeshISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRefMB> *prims,
          mvector<SubGridBuildData> *sgrids,BBox1f *t0t1,range<unsigned_long> *r,size_t k,
          uint geomID)

{
  BBox1f BVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  size_t sVar5;
  PrimRefMB *pPVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  BufferView<embree::Vec3fa> *pBVar18;
  uint uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  BufferView<embree::Vec3fa> *pBVar22;
  size_t *psVar23;
  ulong uVar24;
  undefined4 uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  unsigned_long uVar29;
  uint uVar30;
  ulong uVar31;
  size_t sVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  size_t index;
  long lVar36;
  bool bVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar67;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar68;
  float fVar70;
  undefined1 auVar69 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar76;
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar82;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar83;
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar88;
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  float fVar91;
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  size_t local_170;
  uint local_168;
  unsigned_long local_f0;
  size_t local_e0;
  undefined1 auVar84 [64];
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar21 = r->_begin;
  uVar29 = r->_end;
  if (uVar21 < uVar29) {
    local_e0 = k;
    auVar100 = ZEXT464(0x3f800000);
    auVar90 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar81._8_4_ = 0xff800000;
    auVar81._0_8_ = 0xff800000ff800000;
    auVar81._12_4_ = 0xff800000;
    auVar69 = ZEXT1664(auVar81);
    auVar78._8_4_ = 0x7f800000;
    auVar78._0_8_ = 0x7f8000007f800000;
    auVar78._12_4_ = 0x7f800000;
    auVar84 = ZEXT1664(auVar78);
    local_f0 = 0;
    auVar101._8_4_ = 0xddccb9a2;
    auVar101._0_8_ = 0xddccb9a2ddccb9a2;
    auVar101._12_4_ = 0xddccb9a2;
    auVar99._8_4_ = 0x5dccb9a2;
    auVar99._0_8_ = 0x5dccb9a25dccb9a2;
    auVar99._12_4_ = 0x5dccb9a2;
    auVar95 = ZEXT1664(auVar78);
    auVar92 = ZEXT1664(auVar81);
    auVar89 = ZEXT1664(auVar78);
    auVar77 = ZEXT1664(auVar81);
    local_170 = 0;
    uVar31 = 0;
    do {
      BVar1 = (this->super_GridMesh).super_Geometry.time_range;
      auVar40._8_8_ = 0;
      auVar40._0_4_ = BVar1.lower;
      auVar40._4_4_ = BVar1.upper;
      fVar38 = BVar1.lower;
      auVar81 = vmovshdup_avx(auVar40);
      fVar11 = auVar81._0_4_ - fVar38;
      if (uVar21 < *(ulong *)&(this->super_GridMesh).field_0x70) {
        lVar4 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
        uVar14 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
        lVar36 = *(long *)&(this->super_GridMesh).field_0x68 * uVar21;
        uVar28 = *(uint *)(lVar4 + lVar36);
        if (uVar28 < uVar14) {
          uVar2 = *(ushort *)(lVar4 + 10 + lVar36);
          uVar24 = (ulong)uVar2;
          uVar19 = *(uint *)(lVar4 + 4 + lVar36);
          uVar3 = *(ushort *)(lVar4 + 8 + lVar36);
          uVar27 = (ulong)uVar3;
          if (((uint)uVar3 + uVar19 * (uVar2 - 1) + uVar28) - 1 < uVar14) {
            if (uVar2 != 0) {
              fVar55 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
              auVar81 = ZEXT416((uint)(fVar55 * ((t0t1->lower - fVar38) / fVar11) * 1.0000002));
              auVar81 = vroundss_avx(auVar81,auVar81,9);
              auVar81 = vmaxss_avx(ZEXT816(0),auVar81);
              uVar15 = (uint)auVar81._0_4_;
              auVar81 = ZEXT416((uint)(fVar55 * ((t0t1->upper - fVar38) / fVar11) * 0.99999976));
              auVar81 = vroundss_avx(auVar81,auVar81,10);
              auVar81 = vminss_avx(auVar81,ZEXT416((uint)fVar55));
              uVar14 = 0;
              do {
                if (uVar3 != 0) {
                  uVar35 = 0;
                  do {
                    if (uVar15 <= (uint)(int)auVar81._0_4_) {
                      uVar16 = (long)(int)uVar15;
                      psVar23 = &(this->super_GridMesh).vertices.items[(int)uVar15].
                                 super_RawBufferView.stride;
                      do {
                        auVar78 = vcmpps_avx(*(undefined1 (*) [16])
                                              (((RawBufferView *)(psVar23 + -2))->ptr_ofs +
                                              *psVar23 * (uVar14 * uVar19 + (ulong)uVar28 + uVar35))
                                             ,auVar101,6);
                        auVar40 = vcmpps_avx(*(undefined1 (*) [16])
                                              (((RawBufferView *)(psVar23 + -2))->ptr_ofs +
                                              *psVar23 * (uVar14 * uVar19 + (ulong)uVar28 + uVar35))
                                             ,auVar99,1);
                        auVar78 = vandps_avx(auVar78,auVar40);
                        uVar25 = vmovmskps_avx(auVar78);
                        if ((~(byte)uVar25 & 7) != 0) goto LAB_01991b0a;
                        uVar16 = uVar16 + 1;
                        psVar23 = psVar23 + 7;
                      } while (uVar16 <= (ulong)(long)(int)auVar81._0_4_);
                    }
                    uVar35 = uVar35 + 1;
                  } while (uVar35 != uVar27);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar24);
              if (uVar2 == 1) goto LAB_01991b0a;
            }
            uVar28 = 0;
            do {
              if ((short)uVar27 == 1) {
                uVar27 = 1;
              }
              else {
                uVar14 = (ulong)uVar28;
                sVar32 = uVar31;
                uVar19 = 0;
                do {
                  auVar65 = auVar100._0_16_;
                  uVar24 = (ulong)uVar19;
                  uVar31 = uVar24 + 3;
                  fVar11 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
                  fVar38 = (this->super_GridMesh).super_Geometry.time_range.lower;
                  fVar39 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar38;
                  fVar91 = (t0t1->lower - fVar38) / fVar39;
                  fVar39 = (t0t1->upper - fVar38) / fVar39;
                  fVar38 = fVar11 * fVar91;
                  fVar55 = fVar11 * fVar39;
                  auVar40 = vroundss_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38),9);
                  auVar58 = vroundss_avx(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55),10);
                  auVar81 = vmaxss_avx(auVar40,ZEXT416(0));
                  auVar78 = vminss_avx(auVar58,ZEXT416((uint)fVar11));
                  iVar12 = (int)auVar40._0_4_;
                  if ((int)auVar40._0_4_ < 0) {
                    iVar12 = -1;
                  }
                  iVar13 = (int)fVar11 + 1;
                  if ((int)auVar58._0_4_ < (int)fVar11 + 1) {
                    iVar13 = (int)auVar58._0_4_;
                  }
                  uVar2 = *(ushort *)(lVar4 + 10 + lVar36);
                  uVar16 = (ulong)uVar2;
                  uVar35 = uVar16;
                  if (uVar14 + 3 < uVar16) {
                    uVar35 = uVar14 + 3;
                  }
                  fVar54 = auVar78._0_4_;
                  fVar47 = auVar81._0_4_;
                  local_168 = (uint)uVar2;
                  uVar15 = (uint)uVar27;
                  if (uVar14 < uVar16) {
                    lVar17 = (long)(int)fVar47;
                    pBVar22 = (this->super_GridMesh).vertices.items;
                    pBVar18 = pBVar22 + lVar17;
                    uVar16 = uVar27;
                    if (uVar31 < uVar27) {
                      uVar16 = uVar31;
                    }
                    auVar100 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)
                                                 ));
                    auVar98 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    uVar26 = uVar14;
                    do {
                      if (uVar19 < uVar15) {
                        sVar5 = (pBVar18->super_RawBufferView).stride;
                        pauVar20 = (undefined1 (*) [16])
                                   ((pBVar18->super_RawBufferView).ptr_ofs +
                                   (*(uint *)(lVar4 + lVar36) + uVar24 +
                                   *(uint *)(lVar4 + 4 + lVar36) * uVar26) * sVar5);
                        lVar33 = uVar16 - uVar24;
                        do {
                          auVar81 = *pauVar20;
                          auVar78 = vcmpps_avx(auVar81,auVar101,6);
                          auVar40 = vcmpps_avx(auVar81,auVar99,1);
                          auVar78 = vandps_avx(auVar78,auVar40);
                          uVar25 = vmovmskps_avx(auVar78);
                          if ((~(byte)uVar25 & 7) != 0) {
                            auVar96._8_4_ = 0x7f800000;
                            auVar96._0_8_ = 0x7f8000007f800000;
                            auVar96._12_4_ = 0x7f800000;
                            auVar93._8_4_ = 0xff800000;
                            auVar93._0_8_ = 0xff800000ff800000;
                            auVar93._12_4_ = 0xff800000;
                            goto LAB_0199147d;
                          }
                          auVar78 = vminps_avx(auVar98._0_16_,auVar81);
                          auVar98 = ZEXT1664(auVar78);
                          auVar81 = vmaxps_avx(auVar100._0_16_,auVar81);
                          auVar100 = ZEXT1664(auVar81);
                          pauVar20 = (undefined1 (*) [16])(*pauVar20 + sVar5);
                          lVar33 = lVar33 + -1;
                        } while (lVar33 != 0);
                      }
                      auVar96 = auVar98._0_16_;
                      auVar93 = auVar100._0_16_;
                      uVar26 = uVar26 + 1;
                    } while (uVar26 != uVar35);
LAB_0199147d:
                    lVar33 = (long)(int)fVar54;
                    pBVar22 = pBVar22 + lVar33;
                    uVar16 = uVar27;
                    if (uVar31 < uVar27) {
                      uVar16 = uVar31;
                    }
                    auVar100 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)
                                                 ));
                    auVar98 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    uVar26 = uVar14;
                    do {
                      if (uVar19 < uVar15) {
                        sVar5 = (pBVar22->super_RawBufferView).stride;
                        pauVar20 = (undefined1 (*) [16])
                                   ((pBVar22->super_RawBufferView).ptr_ofs +
                                   (*(uint *)(lVar4 + lVar36) + uVar24 +
                                   *(uint *)(lVar4 + 4 + lVar36) * uVar26) * sVar5);
                        lVar34 = uVar16 - uVar24;
                        do {
                          auVar81 = *pauVar20;
                          auVar78 = vcmpps_avx(auVar81,auVar101,6);
                          auVar40 = vcmpps_avx(auVar81,auVar99,1);
                          auVar78 = vandps_avx(auVar78,auVar40);
                          uVar25 = vmovmskps_avx(auVar78);
                          if ((~(byte)uVar25 & 7) != 0) {
                            auVar41._8_4_ = 0x7f800000;
                            auVar41._0_8_ = 0x7f8000007f800000;
                            auVar41._12_4_ = 0x7f800000;
                            auVar72._8_4_ = 0xff800000;
                            auVar72._0_8_ = 0xff800000ff800000;
                            auVar72._12_4_ = 0xff800000;
                            goto LAB_01991528;
                          }
                          auVar78 = vminps_avx(auVar98._0_16_,auVar81);
                          auVar98 = ZEXT1664(auVar78);
                          auVar81 = vmaxps_avx(auVar100._0_16_,auVar81);
                          auVar100 = ZEXT1664(auVar81);
                          pauVar20 = (undefined1 (*) [16])(*pauVar20 + sVar5);
                          lVar34 = lVar34 + -1;
                        } while (lVar34 != 0);
                      }
                      auVar41 = auVar98._0_16_;
                      auVar72 = auVar100._0_16_;
                      uVar26 = uVar26 + 1;
                    } while (uVar26 != uVar35);
LAB_01991528:
                    if (iVar13 - iVar12 != 1) {
                      if (uVar28 < local_168) {
                        pBVar22 = (this->super_GridMesh).vertices.items;
                        uVar16 = uVar27;
                        if (uVar31 < uVar27) {
                          uVar16 = uVar31;
                        }
                        auVar100 = ZEXT1664(CONCAT412(0xff800000,
                                                      CONCAT48(0xff800000,0xff800000ff800000)));
                        auVar98 = ZEXT1664(CONCAT412(0x7f800000,
                                                     CONCAT48(0x7f800000,0x7f8000007f800000)));
                        uVar26 = uVar14;
                        do {
                          if (uVar19 < uVar15) {
                            sVar5 = pBVar22[lVar17 + 1].super_RawBufferView.stride;
                            pauVar20 = (undefined1 (*) [16])
                                       (pBVar22[lVar17 + 1].super_RawBufferView.ptr_ofs +
                                       (*(uint *)(lVar4 + lVar36) + uVar24 +
                                       *(uint *)(lVar4 + 4 + lVar36) * uVar26) * sVar5);
                            lVar34 = uVar16 - uVar24;
                            do {
                              auVar81 = *pauVar20;
                              auVar78 = vcmpps_avx(auVar81,auVar101,6);
                              auVar40 = vcmpps_avx(auVar81,auVar99,1);
                              auVar78 = vandps_avx(auVar78,auVar40);
                              uVar25 = vmovmskps_avx(auVar78);
                              if ((~(byte)uVar25 & 7) != 0) {
                                auVar42._8_4_ = 0x7f800000;
                                auVar42._0_8_ = 0x7f8000007f800000;
                                auVar42._12_4_ = 0x7f800000;
                                auVar58._8_4_ = 0xff800000;
                                auVar58._0_8_ = 0xff800000ff800000;
                                auVar58._12_4_ = 0xff800000;
                                goto LAB_01991687;
                              }
                              auVar78 = vminps_avx(auVar98._0_16_,auVar81);
                              auVar98 = ZEXT1664(auVar78);
                              auVar81 = vmaxps_avx(auVar100._0_16_,auVar81);
                              auVar100 = ZEXT1664(auVar81);
                              pauVar20 = (undefined1 (*) [16])(*pauVar20 + sVar5);
                              lVar34 = lVar34 + -1;
                            } while (lVar34 != 0);
                          }
                          auVar42 = auVar98._0_16_;
                          auVar58 = auVar100._0_16_;
                          uVar26 = uVar26 + 1;
                        } while (uVar26 != uVar35);
LAB_01991687:
                        uVar16 = uVar27;
                        if (uVar31 < uVar27) {
                          uVar16 = uVar31;
                        }
                        auVar98 = ZEXT1664(CONCAT412(0xff800000,
                                                     CONCAT48(0xff800000,0xff800000ff800000)));
                        auVar100 = ZEXT1664(CONCAT412(0x7f800000,
                                                      CONCAT48(0x7f800000,0x7f8000007f800000)));
                        uVar26 = uVar14;
                        do {
                          if (uVar19 < uVar15) {
                            sVar5 = pBVar22[lVar33 + -1].super_RawBufferView.stride;
                            pauVar20 = (undefined1 (*) [16])
                                       (pBVar22[lVar33 + -1].super_RawBufferView.ptr_ofs +
                                       (*(uint *)(lVar4 + lVar36) + uVar24 +
                                       *(uint *)(lVar4 + 4 + lVar36) * uVar26) * sVar5);
                            lVar17 = uVar16 - uVar24;
                            do {
                              auVar81 = *pauVar20;
                              auVar78 = vcmpps_avx(auVar81,auVar101,6);
                              auVar40 = vcmpps_avx(auVar81,auVar99,1);
                              auVar78 = vandps_avx(auVar40,auVar78);
                              uVar25 = vmovmskps_avx(auVar78);
                              if ((~(byte)uVar25 & 7) != 0) {
                                auVar43._8_4_ = 0x7f800000;
                                auVar43._0_8_ = 0x7f8000007f800000;
                                auVar43._12_4_ = 0x7f800000;
                                auVar74._8_4_ = 0xff800000;
                                auVar74._0_8_ = 0xff800000ff800000;
                                auVar74._12_4_ = 0xff800000;
                                goto LAB_01991744;
                              }
                              auVar78 = vminps_avx(auVar100._0_16_,auVar81);
                              auVar100 = ZEXT1664(auVar78);
                              auVar81 = vmaxps_avx(auVar98._0_16_,auVar81);
                              auVar98 = ZEXT1664(auVar81);
                              pauVar20 = (undefined1 (*) [16])(*pauVar20 + sVar5);
                              lVar17 = lVar17 + -1;
                            } while (lVar17 != 0);
                          }
                          auVar74 = auVar98._0_16_;
                          auVar43 = auVar100._0_16_;
                          uVar26 = uVar26 + 1;
                        } while (uVar26 != uVar35);
                      }
                      else {
                        auVar58._8_4_ = 0xff800000;
                        auVar58._0_8_ = 0xff800000ff800000;
                        auVar58._12_4_ = 0xff800000;
                        auVar42._8_4_ = 0x7f800000;
                        auVar42._0_8_ = 0x7f8000007f800000;
                        auVar42._12_4_ = 0x7f800000;
                        auVar43 = auVar42;
                        auVar74 = auVar58;
                      }
                      goto LAB_01991744;
                    }
LAB_01991542:
                    auVar81 = vmaxss_avx(ZEXT416((uint)(fVar38 - fVar47)),ZEXT816(0) << 0x40);
                    fVar38 = auVar81._0_4_;
                    fVar11 = 1.0 - fVar38;
                    auVar51._0_4_ = fVar38 * auVar41._0_4_;
                    auVar51._4_4_ = fVar38 * auVar41._4_4_;
                    auVar51._8_4_ = fVar38 * auVar41._8_4_;
                    auVar51._12_4_ = fVar38 * auVar41._12_4_;
                    auVar56._4_4_ = fVar11;
                    auVar56._0_4_ = fVar11;
                    auVar56._8_4_ = fVar11;
                    auVar56._12_4_ = fVar11;
                    auVar53 = vfmadd231ps_fma(auVar51,auVar56,auVar96);
                    auVar48._0_4_ = fVar38 * auVar72._0_4_;
                    auVar48._4_4_ = fVar38 * auVar72._4_4_;
                    auVar48._8_4_ = fVar38 * auVar72._8_4_;
                    auVar48._12_4_ = fVar38 * auVar72._12_4_;
                    auVar50 = vfmadd231ps_fma(auVar48,auVar93,auVar56);
                    auVar81 = vmaxss_avx(ZEXT416((uint)(fVar54 - fVar55)),ZEXT816(0) << 0x40);
                    fVar38 = auVar81._0_4_;
                    fVar11 = 1.0 - fVar38;
                    auVar57._0_4_ = auVar96._0_4_ * fVar38;
                    auVar57._4_4_ = auVar96._4_4_ * fVar38;
                    auVar57._8_4_ = auVar96._8_4_ * fVar38;
                    auVar57._12_4_ = auVar96._12_4_ * fVar38;
                    auVar73._4_4_ = fVar11;
                    auVar73._0_4_ = fVar11;
                    auVar73._8_4_ = fVar11;
                    auVar73._12_4_ = fVar11;
                    auVar60 = vfmadd231ps_fma(auVar57,auVar73,auVar41);
                    auVar61._0_4_ = auVar93._0_4_ * fVar38;
                    auVar61._4_4_ = auVar93._4_4_ * fVar38;
                    auVar61._8_4_ = auVar93._8_4_ * fVar38;
                    auVar61._12_4_ = auVar93._12_4_ * fVar38;
                    auVar64 = vfmadd231ps_fma(auVar61,auVar73,auVar72);
                  }
                  else {
                    auVar72._8_4_ = 0xff800000;
                    auVar72._0_8_ = 0xff800000ff800000;
                    auVar72._12_4_ = 0xff800000;
                    auVar41._8_4_ = 0x7f800000;
                    auVar41._0_8_ = 0x7f8000007f800000;
                    auVar41._12_4_ = 0x7f800000;
                    auVar58 = auVar72;
                    auVar93 = auVar72;
                    auVar42 = auVar41;
                    auVar43 = auVar41;
                    auVar74 = auVar72;
                    auVar96 = auVar41;
                    if (iVar13 - iVar12 == 1) goto LAB_01991542;
LAB_01991744:
                    auVar81 = vmaxss_avx(ZEXT416((uint)(fVar38 - fVar47)),ZEXT816(0) << 0x40);
                    fVar47 = auVar81._0_4_;
                    fVar38 = 1.0 - fVar47;
                    auVar52._0_4_ = fVar47 * auVar42._0_4_;
                    auVar52._4_4_ = fVar47 * auVar42._4_4_;
                    auVar52._8_4_ = fVar47 * auVar42._8_4_;
                    auVar52._12_4_ = fVar47 * auVar42._12_4_;
                    auVar62._4_4_ = fVar38;
                    auVar62._0_4_ = fVar38;
                    auVar62._8_4_ = fVar38;
                    auVar62._12_4_ = fVar38;
                    auVar53 = vfmadd231ps_fma(auVar52,auVar62,auVar96);
                    auVar49._0_4_ = fVar47 * auVar58._0_4_;
                    auVar49._4_4_ = fVar47 * auVar58._4_4_;
                    auVar49._8_4_ = fVar47 * auVar58._8_4_;
                    auVar49._12_4_ = fVar47 * auVar58._12_4_;
                    auVar50 = vfmadd231ps_fma(auVar49,auVar62,auVar93);
                    auVar81 = vmaxss_avx(ZEXT416((uint)(fVar54 - fVar55)),ZEXT816(0) << 0x40);
                    fVar55 = auVar81._0_4_;
                    fVar38 = 1.0 - fVar55;
                    auVar59._0_4_ = fVar55 * auVar43._0_4_;
                    auVar59._4_4_ = fVar55 * auVar43._4_4_;
                    auVar59._8_4_ = fVar55 * auVar43._8_4_;
                    auVar59._12_4_ = fVar55 * auVar43._12_4_;
                    auVar44._4_4_ = fVar38;
                    auVar44._0_4_ = fVar38;
                    auVar44._8_4_ = fVar38;
                    auVar44._12_4_ = fVar38;
                    auVar60 = vfmadd231ps_fma(auVar59,auVar44,auVar41);
                    auVar63._0_4_ = fVar55 * auVar74._0_4_;
                    auVar63._4_4_ = fVar55 * auVar74._4_4_;
                    auVar63._8_4_ = fVar55 * auVar74._8_4_;
                    auVar63._12_4_ = fVar55 * auVar74._12_4_;
                    auVar64 = vfmadd231ps_fma(auVar63,auVar44,auVar72);
                    if ((int)(iVar12 + 1U) < iVar13) {
                      uVar16 = (ulong)(iVar12 + 1U);
                      if (uVar27 <= uVar31) {
                        uVar31 = uVar27;
                      }
                      auVar81 = auVar50;
                      auVar78 = auVar53;
                      do {
                        auVar75._8_4_ = 0x7f800000;
                        auVar75._0_8_ = 0x7f8000007f800000;
                        auVar75._12_4_ = 0x7f800000;
                        auVar45._8_4_ = 0xff800000;
                        auVar45._0_8_ = 0xff800000ff800000;
                        auVar45._12_4_ = 0xff800000;
                        if (uVar28 < local_168) {
                          pBVar22 = (this->super_GridMesh).vertices.items + uVar16;
                          auVar100 = ZEXT1664(CONCAT412(0xff800000,
                                                        CONCAT48(0xff800000,0xff800000ff800000)));
                          auVar98 = ZEXT1664(CONCAT412(0x7f800000,
                                                       CONCAT48(0x7f800000,0x7f8000007f800000)));
                          uVar27 = uVar14;
                          do {
                            if (uVar19 < uVar15) {
                              sVar5 = (pBVar22->super_RawBufferView).stride;
                              pauVar20 = (undefined1 (*) [16])
                                         ((pBVar22->super_RawBufferView).ptr_ofs +
                                         (*(uint *)(lVar4 + lVar36) + uVar24 +
                                         *(uint *)(lVar4 + 4 + lVar36) * uVar27) * sVar5);
                              lVar17 = uVar31 - uVar24;
                              do {
                                auVar40 = *pauVar20;
                                auVar58 = vcmpps_avx(auVar40,auVar101,6);
                                auVar93 = vcmpps_avx(auVar40,auVar99,1);
                                auVar58 = vandps_avx(auVar58,auVar93);
                                uVar25 = vmovmskps_avx(auVar58);
                                if ((~(byte)uVar25 & 7) != 0) {
                                  auVar75._8_4_ = 0x7f800000;
                                  auVar75._0_8_ = 0x7f8000007f800000;
                                  auVar75._12_4_ = 0x7f800000;
                                  auVar45._8_4_ = 0xff800000;
                                  auVar45._0_8_ = 0xff800000ff800000;
                                  auVar45._12_4_ = 0xff800000;
                                  goto LAB_019918b0;
                                }
                                auVar58 = vminps_avx(auVar98._0_16_,auVar40);
                                auVar98 = ZEXT1664(auVar58);
                                auVar40 = vmaxps_avx(auVar100._0_16_,auVar40);
                                auVar100 = ZEXT1664(auVar40);
                                pauVar20 = (undefined1 (*) [16])(*pauVar20 + sVar5);
                                lVar17 = lVar17 + -1;
                              } while (lVar17 != 0);
                            }
                            auVar45 = auVar100._0_16_;
                            auVar75 = auVar98._0_16_;
                            uVar27 = uVar27 + 1;
                          } while (uVar27 != uVar35);
                        }
LAB_019918b0:
                        fVar85 = ((float)(int)uVar16 / fVar11 - fVar91) / (fVar39 - fVar91);
                        fVar38 = 1.0 - fVar85;
                        auVar97._0_4_ = auVar60._0_4_ * fVar85;
                        fVar55 = auVar60._4_4_;
                        auVar97._4_4_ = fVar55 * fVar85;
                        fVar54 = auVar60._8_4_;
                        auVar97._8_4_ = fVar54 * fVar85;
                        fVar47 = auVar60._12_4_;
                        auVar97._12_4_ = fVar47 * fVar85;
                        auVar94._4_4_ = fVar38;
                        auVar94._0_4_ = fVar38;
                        auVar94._8_4_ = fVar38;
                        auVar94._12_4_ = fVar38;
                        auVar40 = vfmadd231ps_fma(auVar97,auVar94,auVar78);
                        auVar40 = vsubps_avx(auVar75,auVar40);
                        auVar86._0_4_ = auVar64._0_4_ * fVar85;
                        fVar38 = auVar64._4_4_;
                        auVar86._4_4_ = fVar38 * fVar85;
                        fVar70 = auVar64._8_4_;
                        auVar86._8_4_ = fVar70 * fVar85;
                        fVar71 = auVar64._12_4_;
                        auVar86._12_4_ = fVar71 * fVar85;
                        auVar58 = vfmadd231ps_fma(auVar86,auVar81,auVar94);
                        auVar93 = vsubps_avx(auVar45,auVar58);
                        auVar58 = vminps_avx(auVar40,ZEXT816(0) << 0x20);
                        auVar40 = vmaxps_avx(auVar93,ZEXT816(0) << 0x20);
                        auVar53._0_4_ = auVar78._0_4_ + auVar58._0_4_;
                        auVar53._4_4_ = auVar78._4_4_ + auVar58._4_4_;
                        auVar53._8_4_ = auVar78._8_4_ + auVar58._8_4_;
                        auVar53._12_4_ = auVar78._12_4_ + auVar58._12_4_;
                        auVar60._0_4_ = auVar60._0_4_ + auVar58._0_4_;
                        auVar60._4_4_ = fVar55 + auVar58._4_4_;
                        auVar60._8_4_ = fVar54 + auVar58._8_4_;
                        auVar60._12_4_ = fVar47 + auVar58._12_4_;
                        auVar50._0_4_ = auVar81._0_4_ + auVar40._0_4_;
                        auVar50._4_4_ = auVar81._4_4_ + auVar40._4_4_;
                        auVar50._8_4_ = auVar81._8_4_ + auVar40._8_4_;
                        auVar50._12_4_ = auVar81._12_4_ + auVar40._12_4_;
                        auVar64._0_4_ = auVar64._0_4_ + auVar40._0_4_;
                        auVar64._4_4_ = fVar38 + auVar40._4_4_;
                        auVar64._8_4_ = fVar70 + auVar40._8_4_;
                        auVar64._12_4_ = fVar71 + auVar40._12_4_;
                        uVar16 = uVar16 + 1;
                        auVar81 = auVar50;
                        auVar78 = auVar53;
                      } while (iVar13 != (int)uVar16);
                    }
                  }
                  aVar7 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                          vinsertps_avx(auVar53,ZEXT416(geomID),0x30);
                  uVar30 = (this->super_GridMesh).super_Geometry.numTimeSteps - 1;
                  uVar31 = (ulong)uVar30;
                  BVar1 = (this->super_GridMesh).super_Geometry.time_range;
                  auVar46._8_8_ = 0;
                  auVar46._0_4_ = BVar1.lower;
                  auVar46._4_4_ = BVar1.upper;
                  aVar8 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                          vinsertps_avx(auVar50,ZEXT416((uint)local_e0),0x30);
                  aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                          vinsertps_avx(auVar60,ZEXT416(uVar30),0x30);
                  aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                           vinsertps_avx(auVar64,ZEXT416(uVar30),0x30);
                  auVar78 = vcmpps_avx(auVar65,auVar46,1);
                  auVar40 = vinsertps_avx(auVar65,auVar46,0x50);
                  auVar81 = vblendps_avx(auVar46,auVar65,2);
                  auVar81 = vblendvps_avx(auVar81,auVar40,auVar78);
                  auVar100 = ZEXT1664(auVar81);
                  auVar87._8_4_ = 0x3f000000;
                  auVar87._0_8_ = 0x3f0000003f000000;
                  auVar87._12_4_ = 0x3f000000;
                  auVar65._0_4_ = aVar9.x * 0.5;
                  auVar65._4_4_ = aVar9.y * 0.5;
                  auVar65._8_4_ = aVar9.z * 0.5;
                  auVar65._12_4_ = aVar9.field_3.w * 0.5;
                  auVar81 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar7,auVar87);
                  auVar79._0_4_ = aVar10.x * 0.5;
                  auVar79._4_4_ = aVar10.y * 0.5;
                  auVar79._8_4_ = aVar10.z * 0.5;
                  auVar79._12_4_ = aVar10.field_3.w * 0.5;
                  auVar78 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar8,auVar87);
                  auVar66._0_4_ = auVar81._0_4_ + auVar78._0_4_;
                  auVar66._4_4_ = auVar81._4_4_ + auVar78._4_4_;
                  auVar66._8_4_ = auVar81._8_4_ + auVar78._8_4_;
                  auVar66._12_4_ = auVar81._12_4_ + auVar78._12_4_;
                  local_f0 = local_f0 + 1;
                  local_170 = local_170 + uVar31;
                  bVar37 = sVar32 < uVar31;
                  auVar80[1] = bVar37;
                  auVar80[0] = bVar37;
                  auVar80[2] = bVar37;
                  auVar80[3] = bVar37;
                  auVar80[4] = bVar37;
                  auVar80[5] = bVar37;
                  auVar80[6] = bVar37;
                  auVar80[7] = bVar37;
                  auVar80[8] = bVar37;
                  auVar80[9] = bVar37;
                  auVar80[10] = bVar37;
                  auVar80[0xb] = bVar37;
                  auVar80[0xc] = bVar37;
                  auVar80[0xd] = bVar37;
                  auVar80[0xe] = bVar37;
                  auVar80[0xf] = bVar37;
                  auVar81 = vpslld_avx(auVar80,0x1f);
                  auVar81 = vblendvps_avx(auVar90._0_16_,auVar46,auVar81);
                  auVar90 = ZEXT1664(auVar81);
                  auVar81 = vminps_avx(auVar84._0_16_,auVar66);
                  auVar84 = ZEXT1664(auVar81);
                  if (uVar31 < sVar32) {
                    uVar31 = sVar32;
                  }
                  auVar81 = vmaxps_avx(auVar69._0_16_,auVar66);
                  auVar69 = ZEXT1664(auVar81);
                  uVar30 = uVar19 + 2;
                  auVar81 = vminps_avx(auVar95._0_16_,(undefined1  [16])aVar7);
                  auVar95 = ZEXT1664(auVar81);
                  sgrids->items[local_e0] =
                       (SubGridBuildData)
                       ((ulong)(uVar19 & 0xfffe | (uint)(uVar15 <= uVar30) << 0xf) |
                       (ulong)(uVar28 << 0x10 | (uint)(local_168 <= uVar28 + 2) << 0x1f) |
                       uVar21 << 0x20);
                  pPVar6 = prims->items;
                  pPVar6[local_e0].lbounds.bounds0.lower.field_0 = aVar7;
                  auVar81 = vmaxps_avx(auVar92._0_16_,(undefined1  [16])aVar8);
                  auVar92 = ZEXT1664(auVar81);
                  pPVar6[local_e0].lbounds.bounds0.upper.field_0 = aVar8;
                  auVar81 = vminps_avx(auVar89._0_16_,(undefined1  [16])aVar9);
                  auVar89 = ZEXT1664(auVar81);
                  pPVar6[local_e0].lbounds.bounds1.lower.field_0.field_1 = aVar9;
                  auVar81 = vmaxps_avx(auVar77._0_16_,(undefined1  [16])aVar10);
                  auVar77 = ZEXT1664(auVar81);
                  pPVar6[local_e0].lbounds.bounds1.upper.field_0.field_1 = aVar10;
                  pPVar6[local_e0].time_range = BVar1;
                  local_e0 = local_e0 + 1;
                  uVar2 = *(ushort *)(lVar4 + 8 + lVar36);
                  uVar27 = (ulong)uVar2;
                  sVar32 = uVar31;
                  uVar19 = uVar30;
                } while (uVar30 < uVar2 - 1);
                uVar24 = (ulong)*(ushort *)(lVar4 + 10 + lVar36);
              }
              uVar28 = uVar28 + 2;
            } while (uVar28 < (int)uVar24 - 1U);
            uVar29 = r->_end;
          }
        }
      }
LAB_01991b0a:
      aVar67 = auVar92._0_16_;
      aVar82 = auVar95._0_16_;
      auVar78 = auVar100._0_16_;
      auVar81 = auVar90._0_16_;
      uVar21 = uVar21 + 1;
    } while (uVar21 < uVar29);
    (__return_storage_ptr__->object_range)._end = local_f0;
    aVar88 = auVar89._0_16_;
    aVar76 = auVar77._0_16_;
    aVar83 = auVar84._0_16_;
    aVar68 = auVar69._0_16_;
  }
  else {
    auVar78 = SUB6416(ZEXT464(0x3f800000),0);
    auVar81 = ZEXT816(0x3f80000000000000);
    aVar82.m128[2] = INFINITY;
    aVar82._0_8_ = 0x7f8000007f800000;
    aVar82.m128[3] = INFINITY;
    aVar67.m128[2] = -INFINITY;
    aVar67._0_8_ = 0xff800000ff800000;
    aVar67.m128[3] = -INFINITY;
    uVar31 = 0;
    local_170 = 0;
    aVar88 = aVar82;
    aVar76 = aVar67;
    aVar83 = aVar82;
    aVar68 = aVar67;
  }
  auVar81 = vmovlhps_avx(auVar81,auVar78);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar82;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar67;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar88;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar76;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar83;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar68;
  __return_storage_ptr__->num_time_segments = local_170;
  __return_storage_ptr__->max_num_time_segments = uVar31;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar81._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar81._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar81._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar81._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, mvector<SubGridBuildData>& sgrids, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const override
      {
        PrimInfoMB pinfoMB(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              const PrimRefMB prim(linearBounds(g,x,y,t0t1),numTimeSegments(),time_range,numTimeSegments(),unsigned(geomID),unsigned(k));
              pinfoMB.add_primref(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;
            }
          }
        }
        return pinfoMB;
      }